

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# radiobox.cpp
# Opt level: O3

void __thiscall ftxui::anon_unknown_3::RadioboxBase::~RadioboxBase(RadioboxBase *this)

{
  function<void_()> *pfVar1;
  Decorator *pDVar2;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar3;
  _Manager_type p_Var4;
  pointer pcVar5;
  pointer pBVar6;
  
  (this->super_ComponentBase)._vptr_ComponentBase = (_func_int **)&PTR__RadioboxBase_001744e0;
  p_Var4 = (this->option_).owned_.on_change.super__Function_base._M_manager;
  if (p_Var4 != (_Manager_type)0x0) {
    pfVar1 = &(this->option_).owned_.on_change;
    (*p_Var4)((_Any_data *)pfVar1,(_Any_data *)pfVar1,__destroy_functor);
  }
  p_Var4 = (this->option_).owned_.style_unfocused.super__Function_base._M_manager;
  if (p_Var4 != (_Manager_type)0x0) {
    pDVar2 = &(this->option_).owned_.style_unfocused;
    (*p_Var4)((_Any_data *)pDVar2,(_Any_data *)pDVar2,__destroy_functor);
  }
  p_Var4 = (this->option_).owned_.style_focused.super__Function_base._M_manager;
  if (p_Var4 != (_Manager_type)0x0) {
    pDVar2 = &(this->option_).owned_.style_focused;
    (*p_Var4)((_Any_data *)pDVar2,(_Any_data *)pDVar2,__destroy_functor);
  }
  pcVar5 = (this->option_).owned_.style_unchecked._M_dataplus._M_p;
  paVar3 = &(this->option_).owned_.style_unchecked.field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar5 != paVar3) {
    operator_delete(pcVar5,paVar3->_M_allocated_capacity + 1);
  }
  pcVar5 = (this->option_).owned_.style_checked._M_dataplus._M_p;
  paVar3 = &(this->option_).owned_.style_checked.field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar5 != paVar3) {
    operator_delete(pcVar5,paVar3->_M_allocated_capacity + 1);
  }
  pBVar6 = (this->boxes_).super__Vector_base<ftxui::Box,_std::allocator<ftxui::Box>_>._M_impl.
           super__Vector_impl_data._M_start;
  if (pBVar6 != (pointer)0x0) {
    operator_delete(pBVar6,(long)(this->boxes_).
                                 super__Vector_base<ftxui::Box,_std::allocator<ftxui::Box>_>._M_impl
                                 .super__Vector_impl_data._M_end_of_storage - (long)pBVar6);
  }
  ComponentBase::~ComponentBase(&this->super_ComponentBase);
  return;
}

Assistant:

RadioboxBase(ConstStringListRef entries,
               int* selected,
               Ref<RadioboxOption> option)
      : entries_(entries), selected_(selected), option_(std::move(option)) {
#if defined(FTXUI_MICROSOFT_TERMINAL_FALLBACK)
    // Microsoft terminal do not use fonts able to render properly the default
    // radiobox glyph.
    if (option_->style_checked == "◉ ")
      option_->style_checked = "(*)";
    if (option_->style_unchecked == "○ ")
      option_->style_unchecked = "( )";
#endif
  }